

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O0

bool __thiscall ON_3dmRevisionHistory::IsValid(ON_3dmRevisionHistory *this)

{
  bool bVar1;
  int iVar2;
  bool local_11;
  ON_3dmRevisionHistory *this_local;
  
  bVar1 = LastEditedTimeIsSet(this);
  local_11 = false;
  if (bVar1) {
    iVar2 = ON_CompareRevisionHistoryTime(&this->m_create_time,&this->m_last_edit_time);
    local_11 = iVar2 < 1;
  }
  return local_11;
}

Assistant:

bool ON_3dmRevisionHistory::IsValid() const
{
  return (     LastEditedTimeIsSet() 
            && ON_CompareRevisionHistoryTime(&m_create_time, &m_last_edit_time) <= 0
         );
}